

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O0

string_view __thiscall webfront::uri::URI::next(URI *this,string_view uri)

{
  bool bVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  char *pcVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  string_view sVar5;
  
  if (next::step == 7) {
    next::step = 0;
  }
  else {
    next::step = next::step + 1;
  }
  switch(next::step) {
  case 0:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (in_RDI,(char *)next::step,next::step);
    if (next::mark == 0xffffffffffffffff) {
      http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_10);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    break;
  case 1:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    http::std::basic_string_view<char,_std::char_traits<char>_>::empty
              ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 2));
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (in_RDI,pcVar7,(size_type)pcVar6);
    if (next::mark2 == 0xffffffffffffffff) {
      sVar2 = http::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      next::mark2 = sVar2 - 1;
      http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_10);
    }
    else {
      bVar1 = http::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 2));
      if (bVar1) {
        http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_10);
      }
      else {
        local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
      }
    }
    break;
  case 2:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    http::std::basic_string_view<char,_std::char_traits<char>_>::empty
              ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 2));
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (in_RDI,pcVar7,(size_type)pcVar6);
    if ((next::mark == 0xffffffffffffffff) &&
       (next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find
                               (in_RDI,pcVar7,(size_type)pcVar6), next::mark == 0xffffffffffffffff))
    {
      sVar2 = http::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      next::mark = sVar2 - 1;
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    break;
  case 3:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (in_RDI,(char *)next::step,next::step);
    if (next::mark2 == 0xffffffffffffffff) {
      sVar2 = http::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      next::mark2 = sVar2 - 1;
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    break;
  case 4:
    local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (in_RDI,next::step,next::step);
    break;
  case 5:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (in_RDI,(char *)next::step,next::step);
    if (next::mark == 0xffffffffffffffff) {
      http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_10);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    break;
  case 6:
    pcVar6 = (char *)next::step;
    pcVar7 = (char *)next::step;
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (in_RDI,(char *)next::step,next::step);
    if (next::mark2 == 0xffffffffffffffff) {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RDI,(size_type)pcVar7,(size_type)pcVar6);
    }
    break;
  case 7:
    if (next::mark2 != 0xffffffffffffffff) {
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_RDI,next::step,next::step);
      sVar5._M_len = bVar3._M_len;
      sVar5._M_str = bVar3._M_str;
      return sVar5;
    }
  default:
    http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_10);
  }
  sVar4._M_len = local_10._M_len;
  sVar4._M_str = local_10._M_str;
  return sVar4;
}

Assistant:

std::string_view next(std::string_view uri) const {
        static constexpr size_t schem{0}, autho{1}, path_{2}, quer_{3}, fragm{4}, usrnf{5}, host_{6}, port_{7}, npos = std::string_view::npos; 
        static size_t step{port_}, mark{0}, mark2{0};
        step = (step == port_) ? schem : step + 1;
        switch (step) {
            case schem: mark = uri.find("://"); return mark == npos ? std::string_view{} : uri.substr(0, mark);
            case autho: mark2 = uri.find("/", scheme.empty() ? 0 : mark + 3);
                if (mark2 == npos) { mark2 = uri.size() - 1; return {}; }
                if (scheme.empty()) return {};
                return uri.substr(mark + 3, mark2 - mark - 3);
            case path_: mark = uri.find("?", scheme.empty() ? 0 : mark2 + 1);
                if (mark == npos) {
                    mark = uri.find("#");
                    if (mark == npos) { mark = uri.size() - 1; return uri.substr(mark2); }
                }
                return uri.substr(mark2, mark - mark2);
            case quer_: mark2 = uri.find("#", mark + 1);
                if (mark2 == npos) { mark2 = uri.size() - 1; return uri.substr(mark + 1); } else return uri.substr(mark + 1, mark2 - mark - 1);
            case fragm: return uri.substr(mark2 + 1);
            case usrnf: mark = uri.find("@");
                if (mark == npos) return {}; else return uri.substr(0, mark);
            case host_: mark2 = uri.find(":", mark + 1);
                if (mark2 == npos) return uri.substr(mark + 1); else return uri.substr(mark + 1, mark2 - mark - 1);
            case port_: if (mark2 != npos) return uri.substr(mark2 + 1);
        }
        return {};           
    }